

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O3

void hide_ship_command_proc(Am_Object *command_obj)

{
  Am_Value *pAVar1;
  char cVar2;
  Am_Object new_object;
  Am_Object AStack_18;
  Am_Object local_10;
  
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)command_obj,0x169);
  Am_Object::Am_Object(&local_10,pAVar1);
  cVar2 = Am_Object::Valid();
  if (cVar2 != '\0') {
    Am_Object::Am_Object(&AStack_18,&local_10);
    hide_ship(&AStack_18);
    Am_Object::~Am_Object(&AStack_18);
  }
  Am_Object::~Am_Object(&local_10);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, hide_ship_command,
                 (Am_Object command_obj))
{
  Am_Object new_object = command_obj.Get(Am_VALUE);
  if (new_object.Valid())
    hide_ship(new_object);
}